

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmGlobalUnixMakefileGenerator3::AppendGlobalTargetDepends
          (cmGlobalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,cmGeneratorTarget *target)

{
  bool bVar1;
  TargetType TVar2;
  reference this_00;
  cmGeneratorTarget *this_01;
  undefined1 local_68 [8];
  string tgtName;
  cmLocalUnixMakefileGenerator3 *lg3;
  cmGeneratorTarget *dep;
  _Self local_30;
  const_iterator i;
  TargetDependSet *depends_set;
  cmGeneratorTarget *target_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *depends_local;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  i._M_node = (_Base_ptr)cmGlobalGenerator::GetTargetDirectDepends((cmGlobalGenerator *)this,target)
  ;
  local_30._M_node =
       (_Base_ptr)
       std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::begin
                 ((set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_> *
                  )i._M_node);
  while( true ) {
    dep = (cmGeneratorTarget *)
          std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::end
                    ((set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                      *)i._M_node);
    bVar1 = std::operator!=(&local_30,(_Self *)&dep);
    if (!bVar1) break;
    this_00 = std::_Rb_tree_const_iterator<cmTargetDepend>::operator*(&local_30);
    this_01 = cmTargetDepend::operator_cast_to_cmGeneratorTarget_(this_00);
    TVar2 = cmGeneratorTarget::GetType(this_01);
    if (TVar2 != INTERFACE_LIBRARY) {
      tgtName.field_2._8_8_ = cmGeneratorTarget::GetLocalGenerator(this_01);
      cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                ((string *)local_68,(cmLocalUnixMakefileGenerator3 *)tgtName.field_2._8_8_,this_01);
      std::__cxx11::string::operator+=((string *)local_68,"/all");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(depends,(value_type *)local_68);
      std::__cxx11::string::~string((string *)local_68);
    }
    std::_Rb_tree_const_iterator<cmTargetDepend>::operator++(&local_30);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::AppendGlobalTargetDepends(
  std::vector<std::string>& depends, cmGeneratorTarget* target)
{
  TargetDependSet const& depends_set = this->GetTargetDirectDepends(target);
  for (TargetDependSet::const_iterator i = depends_set.begin();
       i != depends_set.end(); ++i) {
    // Create the target-level dependency.
    cmGeneratorTarget const* dep = *i;
    if (dep->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    cmLocalUnixMakefileGenerator3* lg3 =
      static_cast<cmLocalUnixMakefileGenerator3*>(dep->GetLocalGenerator());
    std::string tgtName =
      lg3->GetRelativeTargetDirectory(const_cast<cmGeneratorTarget*>(dep));
    tgtName += "/all";
    depends.push_back(tgtName);
  }
}